

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

void __thiscall
chaiscript::eval::Dot_Access_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::~Dot_Access_AST_Node
          (Dot_Access_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this)

{
  Dot_Access_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_fun_name);
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::~AST_Node_Impl
            (&this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>);
  return;
}

Assistant:

Dot_Access_AST_Node(std::string t_ast_node_text, Parse_Location t_loc, std::vector<AST_Node_Impl_Ptr<T>> t_children)
          : AST_Node_Impl<T>(std::move(t_ast_node_text), AST_Node_Type::Dot_Access, std::move(t_loc), std::move(t_children))
          , m_fun_name(((this->children[1]->identifier == AST_Node_Type::Fun_Call) || (this->children[1]->identifier == AST_Node_Type::Array_Call))
                           ? this->children[1]->children[0]->text
                           : this->children[1]->text) {
      }